

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrBindingModificationsKHR *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XrInteractionProfileDpadBindingEXT *value_00;
  XrInteractionProfileAnalogThresholdVALVE *value_01;
  char cVar2;
  char cVar3;
  NextChainResult NVar4;
  int iVar5;
  XrResult XVar6;
  uint uVar7;
  ulong uVar8;
  XrResult XVar9;
  uint __val;
  string local_1a0;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_130;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_118;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_100;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_d0;
  string local_b8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  XVar9 = XR_SUCCESS;
  if (value->type != XR_TYPE_BINDING_MODIFICATIONS_KHR) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrBindingModificationsKHR",value->type,
               "VUID-XrBindingModificationsKHR-type-type",XR_TYPE_BINDING_MODIFICATIONS_KHR,
               "XR_TYPE_BINDING_MODIFICATIONS_KHR");
    XVar9 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (!check_pnext) goto LAB_0018dea6;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  NVar4 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar4 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ","");
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_1a0,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::_M_append((char *)&error_message,(ulong)local_1a0._M_dataplus._M_p);
    paVar1 = &local_1a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    local_1a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a0,"VUID-XrBindingModificationsKHR-next-unique","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_e8,objects_info);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "Multiple structures of the same type(s) in \"next\" chain for XrBindingModificationsKHR struct"
               ,"");
    CoreValidLogMessage(instance_info,&local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_e8,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != &error_message.field_2) {
LAB_0018de43:
      operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1
                     );
    }
LAB_0018de50:
    XVar9 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar4 == NEXT_CHAIN_RESULT_ERROR) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,"VUID-XrBindingModificationsKHR-next-next","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_d0,objects_info);
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a0,
               "Invalid structure(s) in \"next\" chain for XrBindingModificationsKHR struct \"next\""
               ,"");
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_d0,&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != &error_message.field_2) goto LAB_0018de43;
    goto LAB_0018de50;
  }
  if (encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(encountered_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)encountered_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)encountered_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(duplicate_ext_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(valid_ext_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)valid_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)valid_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0018dea6:
  if (!check_members || XVar9 != XR_SUCCESS) {
    return XVar9;
  }
  if ((value->bindingModificationCount == 0) ||
     (value->bindingModifications != (XrBindingModificationBaseHeaderKHR **)0x0)) {
    if (value->bindingModifications == (XrBindingModificationBaseHeaderKHR **)0x0) {
      return XR_SUCCESS;
    }
    if (value->bindingModificationCount == 0) {
      return XR_SUCCESS;
    }
    XVar9 = XR_SUCCESS;
    __val = 0;
    while( true ) {
      value_00 = (XrInteractionProfileDpadBindingEXT *)value->bindingModifications[__val];
      if (value_00 == (XrInteractionProfileDpadBindingEXT *)0x0) break;
      if (value->bindingModifications == (XrBindingModificationBaseHeaderKHR **)0x0) {
LAB_0018e10f:
        if (value->bindingModifications != (XrBindingModificationBaseHeaderKHR **)0x0) {
          value_01 = (XrInteractionProfileAnalogThresholdVALVE *)value->bindingModifications[__val];
          iVar5 = 0;
          if (value_01->type == XR_TYPE_INTERACTION_PROFILE_ANALOG_THRESHOLD_VALVE) {
            XVar9 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                     value_01);
            if (XVar9 == XR_SUCCESS) {
              XVar9 = XR_SUCCESS;
              iVar5 = 4;
            }
            else {
              error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_message,
                         "Structure XrBindingModificationsKHR member bindingModifications","");
              std::__cxx11::string::append((char *)&error_message);
              cVar3 = '\x01';
              if (9 < __val) {
                uVar8 = (ulong)__val;
                cVar2 = '\x04';
                do {
                  cVar3 = cVar2;
                  uVar7 = (uint)uVar8;
                  if (uVar7 < 100) {
                    cVar3 = cVar3 + -2;
                    goto LAB_0018e1e2;
                  }
                  if (uVar7 < 1000) {
                    cVar3 = cVar3 + -1;
                    goto LAB_0018e1e2;
                  }
                  if (uVar7 < 10000) goto LAB_0018e1e2;
                  uVar8 = uVar8 / 10000;
                  cVar2 = cVar3 + '\x04';
                } while (99999 < uVar7);
                cVar3 = cVar3 + '\x01';
              }
LAB_0018e1e2:
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_1a0,cVar3);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_1a0._M_dataplus._M_p,(uint)local_1a0._M_string_length,__val);
              std::__cxx11::string::_M_append
                        ((char *)&error_message,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::append((char *)&error_message);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a0,
                         "VUID-XrBindingModificationsKHR-bindingModifications-parameter","");
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_60,objects_info);
              CoreValidLogMessage(instance_info,&local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  command_name,&local_60,&error_message);
              if (local_60.
                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_60.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)error_message._M_dataplus._M_p != &error_message.field_2) {
                operator_delete(error_message._M_dataplus._M_p,
                                error_message.field_2._M_allocated_capacity + 1);
              }
              iVar5 = 1;
            }
          }
          if (iVar5 == 4) goto LAB_0018e34b;
          if (iVar5 != 0) {
            return XR_ERROR_VALIDATION_FAILURE;
          }
        }
        if (value->bindingModifications[__val] != (XrBindingModificationBaseHeaderKHR *)0x0) {
          XVar9 = XR_SUCCESS;
          XVar6 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                   value->bindingModifications[__val]);
          if (XVar6 != XR_SUCCESS) {
            error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&error_message,
                       "VUID-XrBindingModificationsKHR-bindingModifications-parameter","");
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_130,objects_info);
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a0,
                       "Structure XrBindingModificationsKHR member bindingModifications is invalid",
                       "");
            CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_130,&local_1a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_130.
                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_130.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_130.
                                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_130.
                                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)error_message._M_dataplus._M_p != &error_message.field_2) {
              operator_delete(error_message._M_dataplus._M_p,
                              error_message.field_2._M_allocated_capacity + 1);
              return XVar6;
            }
            return XVar6;
          }
        }
      }
      else {
        iVar5 = 0;
        if (value_00->type == XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT) {
          XVar9 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                   value_00);
          if (XVar9 == XR_SUCCESS) {
            XVar9 = XR_SUCCESS;
            iVar5 = 4;
          }
          else {
            error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&error_message,
                       "Structure XrBindingModificationsKHR member bindingModifications","");
            std::__cxx11::string::append((char *)&error_message);
            cVar3 = '\x01';
            if (9 < __val) {
              uVar8 = (ulong)__val;
              cVar2 = '\x04';
              do {
                cVar3 = cVar2;
                uVar7 = (uint)uVar8;
                if (uVar7 < 100) {
                  cVar3 = cVar3 + -2;
                  goto LAB_0018dfd3;
                }
                if (uVar7 < 1000) {
                  cVar3 = cVar3 + -1;
                  goto LAB_0018dfd3;
                }
                if (uVar7 < 10000) goto LAB_0018dfd3;
                uVar8 = uVar8 / 10000;
                cVar2 = cVar3 + '\x04';
              } while (99999 < uVar7);
              cVar3 = cVar3 + '\x01';
            }
LAB_0018dfd3:
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_1a0,cVar3);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_1a0._M_dataplus._M_p,(uint)local_1a0._M_string_length,__val);
            std::__cxx11::string::_M_append
                      ((char *)&error_message,(ulong)local_1a0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&error_message);
            std::__cxx11::string::append((char *)&error_message);
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a0,
                       "VUID-XrBindingModificationsKHR-bindingModifications-parameter","");
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_48,objects_info);
            CoreValidLogMessage(instance_info,&local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_48,&error_message);
            if (local_48.
                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_48.
                                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_48.
                                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)error_message._M_dataplus._M_p != &error_message.field_2) {
              operator_delete(error_message._M_dataplus._M_p,
                              error_message.field_2._M_allocated_capacity + 1);
            }
            iVar5 = 1;
          }
        }
        if (iVar5 != 4) {
          if (iVar5 != 0) {
            return XR_ERROR_VALIDATION_FAILURE;
          }
          goto LAB_0018e10f;
        }
      }
LAB_0018e34b:
      __val = __val + 1;
      if (value->bindingModificationCount <= __val) {
        return XVar9;
      }
    }
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "Structure XrBindingModificationsKHR member bindingModifications","");
    std::__cxx11::string::append((char *)&error_message);
    cVar3 = '\x01';
    if (9 < __val) {
      uVar8 = (ulong)__val;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        uVar7 = (uint)uVar8;
        if (uVar7 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_0018e6ed;
        }
        if (uVar7 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_0018e6ed;
        }
        if (uVar7 < 10000) goto LAB_0018e6ed;
        uVar8 = uVar8 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (99999 < uVar7);
      cVar3 = cVar3 + '\x01';
    }
LAB_0018e6ed:
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1a0,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1a0._M_dataplus._M_p,(uint)local_1a0._M_string_length,__val);
    std::__cxx11::string::_M_append((char *)&error_message,(ulong)local_1a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&error_message);
    std::__cxx11::string::append((char *)&error_message);
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a0,"VUID-XrBindingModificationsKHR-bindingModifications-parameter",
               "");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_118,objects_info);
    CoreValidLogMessage(instance_info,&local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_118,&error_message);
    if (local_118.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p == &error_message.field_2) {
      return XR_ERROR_VALIDATION_FAILURE;
    }
  }
  else {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "VUID-XrBindingModificationsKHR-bindingModifications-parameter","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_100,objects_info);
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a0,
               "Structure XrBindingModificationsKHR member bindingModificationCount is NULL, but value->bindingModificationCount is greater than 0"
               ,"");
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_100,&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_100.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_100.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p == &error_message.field_2) {
      return XR_ERROR_VALIDATION_FAILURE;
    }
  }
  operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrBindingModificationsKHR* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_BINDING_MODIFICATIONS_KHR) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrBindingModificationsKHR",
                             value->type, "VUID-XrBindingModificationsKHR-type-type", XR_TYPE_BINDING_MODIFICATIONS_KHR, "XR_TYPE_BINDING_MODIFICATIONS_KHR");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrBindingModificationsKHR struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrBindingModificationsKHR : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrBindingModificationsKHR struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->bindingModificationCount is non-zero
    if (0 != value->bindingModificationCount && nullptr == value->bindingModifications) {
        CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrBindingModificationsKHR member bindingModificationCount is NULL, but value->bindingModificationCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->bindingModifications) {
        for (uint32_t value_bindingmodifications_inc = 0; value_bindingmodifications_inc < value->bindingModificationCount; ++value_bindingmodifications_inc) {
            if (value->bindingModifications[value_bindingmodifications_inc] == nullptr) {
                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                error_message += "[";
                error_message += std::to_string(value_bindingmodifications_inc);
                error_message += "]";
                error_message += " is null";
                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
            // Validate if XrBindingModificationBaseHeaderKHR is a child structure of type XrInteractionProfileDpadBindingEXT and it is valid
            {
                if (value->bindingModifications != nullptr) {
                    const XrInteractionProfileDpadBindingEXT* const* new_interactionprofiledpadbindingext_value = reinterpret_cast<const XrInteractionProfileDpadBindingEXT* const*>(value->bindingModifications);
                    if (new_interactionprofiledpadbindingext_value[value_bindingmodifications_inc]->type == XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT) {
                        if (nullptr != new_interactionprofiledpadbindingext_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_interactionprofiledpadbindingext_value[value_bindingmodifications_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                                error_message += "[";
                                error_message += std::to_string(value_bindingmodifications_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrBindingModificationBaseHeaderKHR is a child structure of type XrInteractionProfileAnalogThresholdVALVE and it is valid
            {
                if (value->bindingModifications != nullptr) {
                    const XrInteractionProfileAnalogThresholdVALVE* const* new_interactionprofileanalogthresholdvalve_value = reinterpret_cast<const XrInteractionProfileAnalogThresholdVALVE* const*>(value->bindingModifications);
                    if (new_interactionprofileanalogthresholdvalve_value[value_bindingmodifications_inc]->type == XR_TYPE_INTERACTION_PROFILE_ANALOG_THRESHOLD_VALVE) {
                        if (nullptr != new_interactionprofileanalogthresholdvalve_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_interactionprofileanalogthresholdvalve_value[value_bindingmodifications_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                                error_message += "[";
                                error_message += std::to_string(value_bindingmodifications_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate that the base-structure XrBindingModificationBaseHeaderKHR is valid
            if (nullptr != value->bindingModifications[value_bindingmodifications_inc]) {
                xr_result = ValidateXrStruct(instance_info, command_name,
                                                                objects_info, check_members, true, value->bindingModifications[value_bindingmodifications_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                        objects_info,
                                        "Structure XrBindingModificationsKHR member bindingModifications is invalid");
                    return xr_result;
                }
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}